

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

void semchecker(void)

{
  ast *in_stack_00000010;
  
  SEM_Program(in_stack_00000010);
  return;
}

Assistant:

void semchecker() {
    SEM_Program(ast_root);
}